

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvcStreamReader.cpp
# Opt level: O2

int __thiscall
VVCStreamReader::getTSDescriptor
          (VVCStreamReader *this,uint8_t *dstBuff,bool blurayMode,bool hdmvDescriptors)

{
  pointer puVar1;
  uint8_t *buffer;
  VvcSpsUnit *pVVar2;
  pointer puVar3;
  pointer puVar4;
  int iVar5;
  long lVar6;
  uint height;
  uint width;
  uint8_t aspect_ratio_index;
  uint8_t frame_rate_index;
  CheckStreamRez rez;
  
  if (this->m_firstFrame == true) {
    buffer = (this->super_MPEGStreamReader).super_AbstractStreamReader.m_buffer;
    checkStream(&rez,this,buffer,
                *(int *)&(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd -
                (int)buffer);
    CheckStreamRez::~CheckStreamRez(&rez);
  }
  if (hdmvDescriptors) {
    dstBuff[0] = '\x05';
    dstBuff[1] = '\b';
    dstBuff[2] = 'H';
    dstBuff[3] = 'D';
    dstBuff[4] = 'M';
    dstBuff[5] = 'V';
    dstBuff[6] = 0xff;
    dstBuff[7] = '3';
    pVVar2 = this->m_sps;
    if (pVVar2 == (VvcSpsUnit *)0x0) {
      width = 0;
      height = 0;
    }
    else {
      width = pVVar2->pic_width_max_in_luma_samples;
      height = pVVar2->pic_height_max_in_luma_samples;
    }
    M2TSStreamInfo::blurayStreamParams
              ((this->super_MPEGStreamReader).m_fps,false,width,height,
               (this->super_MPEGStreamReader).m_streamAR,(uint8_t *)&rez,&frame_rate_index,
               &aspect_ratio_index);
    dstBuff[8] = (char)rez.codecInfo.codecID << 4 | frame_rate_index;
    dstBuff[9] = aspect_ratio_index << 4 | 0xf;
    iVar5 = 10;
  }
  else {
    *dstBuff = '9';
    dstBuff[2] = (this->m_sps->super_VvcUnitWithProfile).profile_idc * '\x02' |
                 (this->m_sps->super_VvcUnitWithProfile).tier_flag;
    dstBuff[3] = (this->m_sps->super_VvcUnitWithProfile).ptl_num_sub_profiles;
    pVVar2 = this->m_sps;
    puVar3 = (pVVar2->super_VvcUnitWithProfile).general_sub_profile_idc.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (pVVar2->super_VvcUnitWithProfile).general_sub_profile_idc.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (lVar6 = 0; puVar1 = (pointer)((long)puVar3 + lVar6), puVar1 != puVar4; lVar6 = lVar6 + 4) {
      *(uint *)(dstBuff + lVar6 + 4) = *puVar1;
    }
    dstBuff[lVar6 + 4] =
         (pVVar2->super_VvcUnitWithProfile).ptl_frame_only_constraint_flag << 4 |
         pVVar2->non_packed_constraint_flag << 5 |
         pVVar2->interlaced_source_flag << 6 | pVVar2->progressive_source_flag << 7;
    dstBuff[lVar6 + 5] = (this->m_sps->super_VvcUnitWithProfile).level_idc;
    (dstBuff + lVar6 + 6)[0] = '\0';
    (dstBuff + lVar6 + 6)[1] = 0xc0;
    iVar5 = (int)lVar6 + 8;
    dstBuff[1] = (char)lVar6 + '\x06';
  }
  return iVar5;
}

Assistant:

int VVCStreamReader::getTSDescriptor(uint8_t* dstBuff, bool blurayMode, const bool hdmvDescriptors)
{
    if (m_firstFrame)
        CheckStreamRez rez = checkStream(m_buffer, static_cast<int>(m_bufEnd - m_buffer));

    if (hdmvDescriptors)
    {
        *dstBuff++ = static_cast<uint8_t>(TSDescriptorTag::HDMV);  // descriptor tag
        *dstBuff++ = 8;                                            // descriptor length
        *dstBuff++ = 'H';
        *dstBuff++ = 'D';
        *dstBuff++ = 'M';
        *dstBuff++ = 'V';
        *dstBuff++ = 0xff;

        *dstBuff++ = static_cast<int>(StreamType::VIDEO_H266);  // stream_coding_type
        uint8_t video_format, frame_rate_index, aspect_ratio_index;
        M2TSStreamInfo::blurayStreamParams(getFPS(), getInterlaced(), getStreamWidth(), getStreamHeight(),
                                           getStreamAR(), &video_format, &frame_rate_index, &aspect_ratio_index);

        *dstBuff++ = static_cast<uint8_t>(video_format << 4 | frame_rate_index);
        *dstBuff = static_cast<uint8_t>(aspect_ratio_index << 4 | 0xf);

        return 10;  // total descriptor length
    }

    const uint8_t* descStart = dstBuff;

    // ITU-T Rec.H.222 Table 2-133 - VVC video descriptor
    *dstBuff++ = static_cast<uint8_t>(TSDescriptorTag::VVC);
    uint8_t* descLength = dstBuff++;  // descriptor length, filled at the end
    *dstBuff++ = static_cast<uint8_t>(m_sps->profile_idc << 1 | m_sps->tier_flag);
    *dstBuff++ = m_sps->ptl_num_sub_profiles;
    auto bufPos = reinterpret_cast<uint32_t*>(dstBuff);
    for (const auto i : m_sps->general_sub_profile_idc) *bufPos++ = i;
    dstBuff = reinterpret_cast<uint8_t*>(bufPos);
    *dstBuff++ =
        static_cast<uint8_t>(m_sps->progressive_source_flag << 7 | m_sps->interlaced_source_flag << 6 |
                             m_sps->non_packed_constraint_flag << 5 | m_sps->ptl_frame_only_constraint_flag << 4);
    *dstBuff++ = m_sps->level_idc;
    *dstBuff++ = 0;
    *dstBuff++ = 0xc0;

    const uint8_t* descEnd = dstBuff;
    const auto descSize = static_cast<int>(descEnd - descStart);
    *descLength = static_cast<uint8_t>(descSize - 2);  // fill descriptor length

    return descSize;
}